

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

uint64_t mmio_read_wrapper(uc_struct_conflict15 *uc,void *opaque,hwaddr addr,uint size)

{
  uint64_t uVar1;
  mmio_cbs *cbs;
  
  if (*opaque != (code *)0x0) {
    uVar1 = (**opaque)(uc,addr & 0xffffffff,size,*(undefined8 *)((long)opaque + 8));
    return uVar1;
  }
  return 0;
}

Assistant:

static uint64_t mmio_read_wrapper(struct uc_struct *uc, void *opaque, hwaddr addr, unsigned size)
{
    mmio_cbs* cbs = (mmio_cbs*)opaque;

    // We have to care about 32bit target.
    addr = addr & ( (target_ulong)(-1) );
    if (cbs->read) {
        return cbs->read(uc, addr, size, cbs->user_data_read);
    } else {
        return 0;
    }
}